

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

partSizeData *
initTiled(vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
          *pixelData,vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *buf,
         TiledInputPart *in,Header *outHeader)

{
  PixelType PVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  runtime_error *this;
  Channel *pCVar6;
  reference pvVar7;
  reference pvVar8;
  Slice *pSVar9;
  char *pcVar10;
  string *psVar11;
  Compression *pCVar12;
  undefined8 in_RCX;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *in_RDX;
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  *in_RSI;
  partSizeData *in_RDI;
  int samplesize;
  ConstIterator i;
  int channelNumber;
  uint64_t offsetToOrigin;
  uint64_t numPixels;
  uint64_t height;
  uint64_t width;
  Box2i dw;
  int yLevel;
  int xLevel;
  int tileCount;
  size_t totalPixels;
  int64_t pixelSize;
  int levelIndex;
  int totalLevels;
  Box2i imageDw;
  TileDescription tiling;
  int numChans;
  partSizeData *data;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  Header *in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe78;
  partSizeData *in_stack_fffffffffffffe80;
  Slice local_118 [60];
  int local_dc;
  undefined8 local_d8;
  undefined8 local_d0;
  int local_c4;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  uint64_t local_80;
  long local_78;
  int local_70;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  ulong uStack_40;
  int local_2c;
  undefined8 local_20;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *local_18;
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Imf_3_4::TiledInputPart::header();
  local_2c = channelCount(in_stack_fffffffffffffe70);
  Imf_3_4::TiledInputPart::header();
  puVar5 = (undefined8 *)Imf_3_4::Header::tileDescription();
  local_48 = *puVar5;
  uStack_40 = puVar5[1];
  Imf_3_4::TiledInputPart::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  switch(uStack_40 & 0xffffffff) {
  case 0:
    local_5c = 1;
  case 1:
    local_5c = Imf_3_4::TiledInputPart::numLevels();
    break;
  case 2:
    iVar3 = Imf_3_4::TiledInputPart::numXLevels();
    local_5c = Imf_3_4::TiledInputPart::numYLevels();
    local_5c = iVar3 * local_5c;
    break;
  case 3:
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"unknown tile mode");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
            *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::resize
            ((vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_70 = 0;
  local_78 = 0;
  local_80 = 0;
  local_84 = 0;
  for (local_88 = 0; iVar3 = local_88, iVar4 = Imf_3_4::TiledInputPart::numXLevels(), iVar3 < iVar4;
      local_88 = local_88 + 1) {
    for (local_8c = 0; iVar3 = local_8c, iVar4 = Imf_3_4::TiledInputPart::numYLevels(),
        iVar3 < iVar4; local_8c = local_8c + 1) {
      if (((int)uStack_40 == 2) || (local_88 == local_8c)) {
        iVar3 = local_88;
        iVar4 = local_8c;
        Imf_3_4::dataWindowForLevel
                  ((TileDescription *)&local_9c,(int)&local_48,local_58,local_50,local_54,local_4c,
                   local_88);
        local_a8 = (long)((local_94 + 1) - local_9c);
        local_b0 = (long)((local_90 + 1) - local_98);
        local_b8 = local_a8 * local_b0;
        local_c0 = local_a8 * local_98 + (long)local_9c;
        local_c4 = 0;
        std::
        vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
        ::operator[](local_10,(long)local_70);
        std::
        vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ::resize((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        local_78 = 0;
        Imf_3_4::Header::channels();
        local_d0 = Imf_3_4::ChannelList::begin();
        while( true ) {
          Imf_3_4::Header::channels();
          local_d8 = Imf_3_4::ChannelList::end();
          bVar2 = Imf_3_4::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffe64,iVar4),
                                      (ConstIterator *)CONCAT44(in_stack_fffffffffffffe5c,iVar3));
          if (!bVar2) break;
          pCVar6 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x113ee7);
          local_dc = Imf_3_4::pixelTypeSize(*(PixelType *)pCVar6);
          pvVar7 = std::
                   vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                   ::operator[](local_10,(long)local_70);
          std::
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::operator[](pvVar7,(long)local_c4);
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe80,
                     in_stack_fffffffffffffe78);
          pvVar8 = std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::
                   operator[](local_18,(long)local_70);
          pSVar9 = (Slice *)Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x113f5d);
          pCVar6 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x113f6f);
          PVar1 = *(PixelType *)pCVar6;
          pvVar7 = std::
                   vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                   ::operator[](local_10,(long)local_70);
          std::
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::operator[](pvVar7,(long)local_c4);
          pcVar10 = std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)0x113fa2);
          iVar3 = 1;
          iVar4 = 0;
          Imf_3_4::Slice::Slice
                    (local_118,PVar1,pcVar10 + -(local_c0 * local_dc),(long)local_dc,
                     local_dc * local_a8,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pvVar8,pSVar9);
          local_c4 = local_c4 + 1;
          local_78 = local_dc + local_78;
          Imf_3_4::ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe64,iVar4));
        }
        local_80 = local_b8 + local_80;
        local_70 = local_70 + 1;
      }
      iVar3 = Imf_3_4::TiledInputPart::numXTiles((int)local_20);
      iVar4 = Imf_3_4::TiledInputPart::numYTiles((int)local_20);
      local_84 = iVar3 * iVar4 + local_84;
    }
  }
  partSizeData::partSizeData(in_stack_fffffffffffffe80);
  in_RDI->rawSize = local_78 * local_80;
  in_RDI->pixelCount = local_80;
  in_RDI->tileCount = (long)local_84;
  in_RDI->isTiled = true;
  Imf_3_4::TiledInputPart::header();
  psVar11 = (string *)Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&in_RDI->partType,psVar11);
  Imf_3_4::TiledInputPart::header();
  pCVar12 = (Compression *)Imf_3_4::Header::compression();
  in_RDI->compression = *pCVar12;
  in_RDI->channelCount = (long)local_2c;
  return in_RDI;
}

Assistant:

partSizeData
initTiled (
    vector<vector<vector<char>>>& pixelData,
    vector<FrameBuffer>&          buf,
    TiledInputPart&               in,
    const Header&                 outHeader)
{
    int             numChans = channelCount (in.header ());
    TileDescription tiling   = in.header ().tileDescription ();

    Box2i imageDw = in.header ().dataWindow ();
    int   totalLevels;
    switch (tiling.mode)
    {
        case ONE_LEVEL: totalLevels = 1; //break;
        case MIPMAP_LEVELS: totalLevels = in.numLevels (); break;
        case RIPMAP_LEVELS:
            totalLevels = in.numXLevels () * in.numYLevels ();
            break;
        case NUM_LEVELMODES:
        default: throw runtime_error ("unknown tile mode");
    }
    pixelData.resize (totalLevels);
    buf.resize (totalLevels);

    int     levelIndex  = 0;
    int64_t pixelSize   = 0;
    size_t  totalPixels = 0;
    int     tileCount   = 0;

    //
    // allocate memory and initialize frameBuffer for each level
    //
    for (int xLevel = 0; xLevel < in.numXLevels (); ++xLevel)
    {
        for (int yLevel = 0; yLevel < in.numYLevels (); ++yLevel)
        {
            if (tiling.mode == RIPMAP_LEVELS || xLevel == yLevel)
            {
                Box2i dw = dataWindowForLevel (
                    tiling,
                    imageDw.min.x,
                    imageDw.max.x,
                    imageDw.min.y,
                    imageDw.max.y,
                    xLevel,
                    yLevel);
                uint64_t width     = dw.max.x + 1 - dw.min.x;
                uint64_t height    = dw.max.y + 1 - dw.min.y;
                uint64_t numPixels = width * height;
                uint64_t offsetToOrigin =
                    width * static_cast<uint64_t> (dw.min.y) +
                    static_cast<uint64_t> (dw.min.x);
                int channelNumber = 0;

                pixelData[levelIndex].resize (numChans);
                pixelSize = 0;
                for (ChannelList::ConstIterator i =
                         outHeader.channels ().begin ();
                     i != outHeader.channels ().end ();
                     ++i)
                {
                    int samplesize = pixelTypeSize (i.channel ().type);
                    pixelData[levelIndex][channelNumber].resize (
                        numPixels * samplesize);

                    buf[levelIndex].insert (
                        i.name (),
                        Slice (
                            i.channel ().type,
                            pixelData[levelIndex][channelNumber].data () -
                                offsetToOrigin * samplesize,
                            samplesize,
                            samplesize * width));
                    ++channelNumber;
                    pixelSize += samplesize;
                }
                totalPixels += numPixels;
                ++levelIndex;
            }
            tileCount += in.numXTiles (xLevel) * in.numYTiles (yLevel);
        }
    }
    partSizeData data;
    data.rawSize      = pixelSize * totalPixels;
    data.pixelCount   = totalPixels;
    data.tileCount    = tileCount;
    data.isTiled      = true;
    data.partType     = in.header ().type ();
    data.compression  = in.header ().compression ();
    data.channelCount = numChans;
    return data;
}